

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Expression
cnn::expr::detail::
f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
          (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *xs)

{
  bool bVar1;
  pointer pEVar2;
  size_type __n;
  reference this;
  int iVar3;
  undefined8 extraout_RDX;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar4;
  const_iterator xi;
  int i;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> xis;
  ComputationGraph *pg;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_ffffffffffffff68;
  VariableIndex *in_stack_ffffffffffffff70;
  ComputationGraph *this_00;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *this_01;
  __normal_iterator<const_cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
  local_58;
  int iVar5;
  undefined4 in_stack_ffffffffffffffb4;
  ComputationGraph *in_stack_ffffffffffffffb8;
  undefined1 local_39 [25];
  __normal_iterator<const_cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
  local_20;
  ComputationGraph *local_18;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  local_20._M_current =
       (Expression *)
       std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::begin
                 (in_stack_ffffffffffffff68);
  pEVar2 = __gnu_cxx::
           __normal_iterator<const_cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
           ::operator->(&local_20);
  local_18 = pEVar2->pg;
  __n = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size(local_10);
  this_01 = (vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)local_39;
  std::allocator<cnn::VariableIndex>::allocator((allocator<cnn::VariableIndex> *)0x5f282c);
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::vector
            (this_01,__n,(allocator_type *)this_00);
  std::allocator<cnn::VariableIndex>::~allocator((allocator<cnn::VariableIndex> *)0x5f284c);
  iVar5 = 0;
  local_58._M_current =
       (Expression *)
       std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::begin
                 (in_stack_ffffffffffffff68);
  while( true ) {
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::end
              (in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
             ::operator->(&local_58);
    in_stack_ffffffffffffff70 = &pEVar2->i;
    iVar3 = iVar5 + 1;
    this = std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::operator[]
                     ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                      (local_39 + 1),(long)iVar5);
    VariableIndex::operator=(this,in_stack_ffffffffffffff70);
    __gnu_cxx::
    __normal_iterator<const_cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
    ::operator++(&local_58);
    iVar5 = iVar3;
  }
  ComputationGraph::
  add_function<cnn::Concatenate,std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>>
            (in_stack_ffffffffffffffb8,
             (vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,iVar5));
  Expression::Expression((Expression *)this_00,in_RDI,in_stack_ffffffffffffff70);
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::~vector
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)this_00);
  EVar4._8_8_ = extraout_RDX;
  EVar4.pg = this_00;
  return EVar4;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }